

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

int __thiscall ChebTools::ChebyshevCollection::get_index(ChebyshevCollection *this,double x)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  double dVar5;
  int local_44;
  int local_20;
  int iM;
  int iR;
  int iL;
  double x_local;
  ChebyshevCollection *this_local;
  
  iM = 0;
  sVar3 = std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
          ::size(&this->m_exps);
  iVar1 = (int)sVar3 + -1;
  while (local_20 = iVar1, 1 < local_20 - iM) {
    iVar2 = midpoint_Knuth(iM,local_20);
    pvVar4 = std::
             vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
             operator[](&this->m_exps,(long)iVar2);
    dVar5 = ChebyshevExpansion::xmin(pvVar4);
    iVar1 = iVar2;
    if (dVar5 <= x) {
      iVar1 = local_20;
      iM = iVar2;
    }
  }
  pvVar4 = std::
           vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
           operator[](&this->m_exps,(long)iM);
  dVar5 = ChebyshevExpansion::xmax(pvVar4);
  if (dVar5 <= x) {
    local_44 = local_20;
  }
  else {
    local_44 = iM;
  }
  return local_44;
}

Assistant:

int get_index(double x) const {
            int iL = 0, iR = static_cast<int>(m_exps.size()) - 1, iM;
            while (iR - iL > 1) {
                iM = midpoint_Knuth(iL, iR);
                if (x >= m_exps[iM].xmin()) {
                    iL = iM;
                }
                else {
                    iR = iM;
                }
            }
            return (x < m_exps[iL].xmax()) ? iL : iR;
        }